

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

ENetAcknowledgement *
enet_peer_queue_acknowledgement(ENetPeer *peer,ENetProtocol *command,enet_uint16 sentTime)

{
  ushort uVar1;
  ushort in_DX;
  void *in_RSI;
  long in_RDI;
  enet_uint16 currentWindow;
  enet_uint16 reliableWindow;
  ENetChannel *channel;
  ENetAcknowledgement *acknowledgement;
  ushort local_32;
  size_t in_stack_ffffffffffffffd0;
  ENetAcknowledgement *local_8;
  
  if ((ulong)*(byte *)((long)in_RSI + 1) < *(ulong *)(in_RDI + 0x48)) {
    in_stack_ffffffffffffffd0 = *(long *)(in_RDI + 0x40) + (ulong)*(byte *)((long)in_RSI + 1) * 0x50
    ;
    local_32 = *(ushort *)((long)in_RSI + 2) / 0x1000;
    uVar1 = *(ushort *)(in_stack_ffffffffffffffd0 + 0x26) / 0x1000;
    if (*(ushort *)((long)in_RSI + 2) < *(ushort *)(in_stack_ffffffffffffffd0 + 0x26)) {
      local_32 = local_32 + 0x10;
    }
    if (((ushort)(uVar1 + 7) <= local_32) && (local_32 <= (ushort)(uVar1 + 8))) {
      return (ENetAcknowledgement *)0x0;
    }
  }
  local_8 = (ENetAcknowledgement *)enet_malloc(in_stack_ffffffffffffffd0);
  if (local_8 == (ENetAcknowledgement *)0x0) {
    local_8 = (ENetAcknowledgement *)0x0;
  }
  else {
    *(int *)(in_RDI + 100) = *(int *)(in_RDI + 100) + 8;
    local_8->sentTime = (uint)in_DX;
    memcpy(&local_8->command,in_RSI,0x32);
    enet_list_insert((ENetListIterator)(in_RDI + 0xe0),local_8);
  }
  return local_8;
}

Assistant:

ENetAcknowledgement *
enet_peer_queue_acknowledgement (ENetPeer * peer, const ENetProtocol * command, enet_uint16 sentTime)
{
    ENetAcknowledgement * acknowledgement;

    if (command -> header.channelID < peer -> channelCount)
    {
        ENetChannel * channel = & peer -> channels [command -> header.channelID];
        enet_uint16 reliableWindow = command -> header.reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE,
                    currentWindow = channel -> incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

        if (command -> header.reliableSequenceNumber < channel -> incomingReliableSequenceNumber)
           reliableWindow += ENET_PEER_RELIABLE_WINDOWS;

        if (reliableWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1 && reliableWindow <= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS)
          return NULL;
    }

    acknowledgement = (ENetAcknowledgement *) enet_malloc (sizeof (ENetAcknowledgement));
    if (acknowledgement == NULL)
      return NULL;

    peer -> outgoingDataTotal += sizeof (ENetProtocolAcknowledge);

    acknowledgement -> sentTime = sentTime;
    acknowledgement -> command = * command;
    
    enet_list_insert (enet_list_end (& peer -> acknowledgements), acknowledgement);
    
    return acknowledgement;
}